

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCacheStore(Parse *pParse,int iTab,int iCol,int iReg)

{
  yColCache *pyVar1;
  uint uVar2;
  long lVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  
  if ((pParse->db->dbOptFlags & 2) == 0) {
    lVar3 = 0;
    do {
      if (*(int *)((long)&pParse->aColCache[0].iReg + lVar3) == 0) {
        *(int *)((long)&pParse->aColCache[0].iLevel + lVar3) = pParse->iCacheLevel;
        *(int *)((long)&pParse->aColCache[0].iTable + lVar3) = iTab;
        *(int *)((long)&pParse->aColCache[0].iColumn + lVar3) = iCol;
        pyVar1 = (yColCache *)((long)&pParse->aColCache[0].iTable + lVar3);
        goto LAB_0016c215;
      }
      lVar3 = lVar3 + 0x18;
    } while ((int)lVar3 != 0xf0);
    piVar4 = &pParse->aColCache[0].lru;
    uVar5 = 0;
    iVar6 = 0x7fffffff;
    uVar2 = 0xffffffff;
    do {
      if (*piVar4 < iVar6) {
        uVar2 = uVar5;
        iVar6 = *piVar4;
      }
      uVar5 = uVar5 + 1;
      piVar4 = piVar4 + 6;
    } while (uVar5 != 10);
    if (-1 < (int)uVar2) {
      pyVar1 = pParse->aColCache + uVar2;
      pyVar1->iLevel = pParse->iCacheLevel;
      pyVar1->iTable = iTab;
      pyVar1->iColumn = iCol;
LAB_0016c215:
      pyVar1->iReg = iReg;
      pyVar1->tempReg = '\0';
      iVar6 = pParse->iCacheCnt;
      pParse->iCacheCnt = iVar6 + 1;
      pyVar1->lru = iVar6;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheStore(Parse *pParse, int iTab, int iCol, int iReg){
  int i;
  int minLru;
  int idxLru;
  struct yColCache *p;

  assert( iReg>0 );  /* Register numbers are always positive */
  assert( iCol>=-1 && iCol<32768 );  /* Finite column numbers */

  /* The SQLITE_ColumnCache flag disables the column cache.  This is used
  ** for testing only - to verify that SQLite always gets the same answer
  ** with and without the column cache.
  */
  if( OptimizationDisabled(pParse->db, SQLITE_ColumnCache) ) return;

  /* First replace any existing entry.
  **
  ** Actually, the way the column cache is currently used, we are guaranteed
  ** that the object will never already be in cache.  Verify this guarantee.
  */
#ifndef NDEBUG
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    assert( p->iReg==0 || p->iTable!=iTab || p->iColumn!=iCol );
  }
#endif

  /* Find an empty slot and replace it */
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    if( p->iReg==0 ){
      p->iLevel = pParse->iCacheLevel;
      p->iTable = iTab;
      p->iColumn = iCol;
      p->iReg = iReg;
      p->tempReg = 0;
      p->lru = pParse->iCacheCnt++;
      return;
    }
  }

  /* Replace the last recently used */
  minLru = 0x7fffffff;
  idxLru = -1;
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    if( p->lru<minLru ){
      idxLru = i;
      minLru = p->lru;
    }
  }
  if( ALWAYS(idxLru>=0) ){
    p = &pParse->aColCache[idxLru];
    p->iLevel = pParse->iCacheLevel;
    p->iTable = iTab;
    p->iColumn = iCol;
    p->iReg = iReg;
    p->tempReg = 0;
    p->lru = pParse->iCacheCnt++;
    return;
  }
}